

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluateTest.hpp
# Opt level: O3

void Qentem::Test::TestEvaluate18(QTest *test)

{
  Value<char> value;
  QNumber64 number;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_70;
  undefined1 local_60;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_58;
  char local_48;
  QNumber64 local_38;
  
  local_38.Natural = 0xffffffffffffffff;
  local_58.array_.storage_ = (Value<char> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  Value<char>::reset((Value<char> *)&local_58.array_);
  local_48 = '\x03';
  local_70.number_ = (QNumber64)0x2;
  local_60 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_58.array_,(Value<char> *)&local_70.array_);
  Value<char>::~Value((Value<char> *)&local_70.array_);
  if (local_48 != '\x03') {
    Value<char>::reset((Value<char> *)&local_58.array_);
    local_48 = '\x03';
  }
  local_70.number_ = (QNumber64)0x3;
  local_60 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_58.array_,(Value<char> *)&local_70.array_);
  Value<char>::~Value((Value<char> *)&local_70.array_);
  if (local_48 != '\x03') {
    Value<char>::reset((Value<char> *)&local_58.array_);
    local_48 = '\x03';
  }
  local_70.number_ = (QNumber64)0xfffffffffffffffe;
  local_60 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_58.array_,(Value<char> *)&local_70.array_);
  Value<char>::~Value((Value<char> *)&local_70.array_);
  if (local_48 != '\x03') {
    Value<char>::reset((Value<char> *)&local_58.array_);
    local_48 = '\x03';
  }
  local_70.number_ = (QNumber64)0xfffffffffffffffd;
  local_60 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_58.array_,(Value<char> *)&local_70.array_);
  Value<char>::~Value((Value<char> *)&local_70.array_);
  if (local_48 != '\x03') {
    Value<char>::reset((Value<char> *)&local_58.array_);
    local_48 = '\x03';
  }
  local_70.array_.storage_ = (Value<char> *)0x4010000000000000;
  local_60 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_58.array_,(Value<char> *)&local_70.array_);
  Value<char>::~Value((Value<char> *)&local_70.array_);
  if (local_48 != '\x03') {
    Value<char>::reset((Value<char> *)&local_58.array_);
    local_48 = '\x03';
  }
  local_70.array_.storage_ = (Value<char> *)0xc010000000000000;
  local_60 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_58.array_,(Value<char> *)&local_70.array_);
  Value<char>::~Value((Value<char> *)&local_70.array_);
  local_38 = TestEvaluate("{var:0}%{var:0}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x10df);
  local_38 = TestEvaluate("{var:0}%{var:1}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x10e3);
  local_38 = TestEvaluate("{var:0}%{var:2}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x10e7);
  local_38 = TestEvaluate("{var:0}%{var:3}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x10eb);
  local_38 = TestEvaluate("{var:0}%{var:4}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x10ef);
  local_38 = TestEvaluate("{var:0}%{var:5}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x10f3);
  local_38 = TestEvaluate("{var:1}%{var:0}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x10f9);
  local_38 = TestEvaluate("{var:1}%{var:1}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x10fd);
  local_38 = TestEvaluate("{var:1}%{var:2}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1101);
  local_38 = TestEvaluate("{var:1}%{var:3}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1105);
  local_38 = TestEvaluate("{var:1}%{var:4}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x3;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1109);
  local_38 = TestEvaluate("{var:1}%{var:5}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x3;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x110d);
  local_38 = TestEvaluate("{var:2}%{var:0}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1113);
  local_38 = TestEvaluate("{var:2}%{var:1}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x1117);
  local_38 = TestEvaluate("{var:2}%{var:2}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x111b);
  local_38 = TestEvaluate("{var:2}%{var:3}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x111f);
  local_38 = TestEvaluate("{var:2}%{var:4}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x1123);
  local_38 = TestEvaluate("{var:2}%{var:5}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x1127);
  local_38 = TestEvaluate("{var:3}%{var:0}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xffffffff;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x112d);
  local_38 = TestEvaluate("{var:3}%{var:1}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1131);
  local_38 = TestEvaluate("{var:3}%{var:2}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xffffffff;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x1135);
  local_38 = TestEvaluate("{var:3}%{var:3}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1139);
  local_38 = TestEvaluate("{var:3}%{var:4}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffd;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x113d);
  local_38 = TestEvaluate("{var:3}%{var:5}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffd;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x1141);
  local_38 = TestEvaluate("{var:4}%{var:0}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1147);
  local_38 = TestEvaluate("{var:4}%{var:1}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x114b);
  local_38 = TestEvaluate("{var:4}%{var:2}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x114f);
  local_38 = TestEvaluate("{var:4}%{var:3}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1153);
  local_38 = TestEvaluate("{var:4}%{var:4}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1157);
  local_38 = TestEvaluate("{var:4}%{var:5}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x115b);
  local_38 = TestEvaluate("{var:5}%{var:0}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1161);
  local_38 = TestEvaluate("{var:5}%{var:1}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xffffffff;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x1165);
  local_38 = TestEvaluate("{var:5}%{var:2}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1169);
  local_38 = TestEvaluate("{var:5}%{var:3}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xffffffff;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x116d);
  local_38 = TestEvaluate("{var:5}%{var:4}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1171);
  local_38 = TestEvaluate("{var:5}%{var:5}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1175);
  local_38 = TestEvaluate("{var:1}%{var:0}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x117b);
  local_38 = TestEvaluate("{var:2}%{var:0}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x117f);
  local_38 = TestEvaluate("{var:3}%{var:0}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xffffffff;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x1183);
  local_38 = TestEvaluate("{var:4}%{var:0}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1187);
  local_38 = TestEvaluate("{var:5}%{var:0}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x118b);
  local_38 = TestEvaluate("{var:0}%{var:1}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1191);
  local_38 = TestEvaluate("{var:2}%{var:1}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x1195);
  local_38 = TestEvaluate("{var:3}%{var:1}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x1199);
  local_38 = TestEvaluate("{var:4}%{var:1}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x119d);
  local_38 = TestEvaluate("{var:5}%{var:1}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xffffffff;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x11a1);
  local_38 = TestEvaluate("{var:0}%{var:2}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11a7);
  local_38 = TestEvaluate("{var:1}%{var:2}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11ab);
  local_38 = TestEvaluate("{var:3}%{var:2}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xffffffff;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x11af);
  local_38 = TestEvaluate("{var:4}%{var:2}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11b3);
  local_38 = TestEvaluate("{var:5}%{var:2}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11b7);
  local_38 = TestEvaluate("{var:0}%{var:3}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11bd);
  local_38 = TestEvaluate("{var:1}%{var:3}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11c1);
  local_38 = TestEvaluate("{var:2}%{var:3}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x11c5);
  local_38 = TestEvaluate("{var:4}%{var:3}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x1;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11c9);
  local_38 = TestEvaluate("{var:5}%{var:3}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xffffffff;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x11cd);
  local_38 = TestEvaluate("{var:0}%{var:4}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11d3);
  local_38 = TestEvaluate("{var:1}%{var:4}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x3;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11d7);
  local_38 = TestEvaluate("{var:2}%{var:4}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x11db);
  local_38 = TestEvaluate("{var:3}%{var:4}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffd;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x11df);
  local_38 = TestEvaluate("{var:5}%{var:4}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11e3);
  local_38 = TestEvaluate("{var:0}%{var:5}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x2;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11e9);
  local_38 = TestEvaluate("{var:1}%{var:5}",(Value<char> *)&local_58.array_);
  local_70.number_ = (QNumber64)0x3;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11ed);
  local_38 = TestEvaluate("{var:2}%{var:5}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffe;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x11f1);
  local_38 = TestEvaluate("{var:3}%{var:5}",(Value<char> *)&local_58.array_);
  local_70._0_4_ = 0xfffffffd;
  QTest::IsEqual<long_long,int>(test,&local_38.Integer,(int *)&local_70,0x11f5);
  local_38 = TestEvaluate("{var:4}%{var:5}",(Value<char> *)&local_58.array_);
  local_70.array_.storage_ = (Value<char> *)0x0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            (test,&local_38.Natural,(unsigned_long_long *)&local_70.number_,0x11f9);
  Value<char>::~Value((Value<char> *)&local_58.array_);
  return;
}

Assistant:

static void TestEvaluate18(QTest &test) {
    Value<char> value;
    QNumber64   number{-1};
    const char *content;

    value += 2U;
    value += 3U;
    value += -2;
    value += -3;
    value += 4.0F;
    value += -4.0F;

    content = "{var:0}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:0}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:0}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:0}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:0}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:0}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    //////////////////

    content = "{var:1}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:1}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:1}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:1}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:1}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    content = "{var:1}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    //////////////////

    content = "{var:2}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:2}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:2}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:2}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:2}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:2}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    //////////////////

    content = "{var:3}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:3}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:3}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:3}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:3}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    content = "{var:3}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    //////////

    content = "{var:4}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:4}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:4}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////

    content = "{var:5}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:5}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:5}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    ////////////////////////////////////////

    content = "{var:1}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:2}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:3}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:4}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////////////

    content = "{var:0}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:2}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:3}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:5}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    //////////////////

    content = "{var:0}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:1}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:3}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:4}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////////////

    content = "{var:0}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:1}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:2}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:4}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:5}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    //////////

    content = "{var:0}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:1}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    content = "{var:2}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:3}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    content = "{var:5}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////

    content = "{var:0}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:1}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    content = "{var:2}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:3}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    content = "{var:4}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);
}